

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_string.cpp
# Opt level: O0

void anon_unknown.dwarf_cea1f::test_error(string *str)

{
  bool bVar1;
  Message *message;
  AssertHelper local_248;
  Message local_240 [2];
  parser_error_t *anon_var_0;
  char *pcStack_228;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  events_aggregator_t handler;
  istringstream local_1e8 [8];
  istringstream input;
  Message local_68;
  ScopedTrace local_5d [8];
  ScopedTrace gtest_trace_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string scope;
  string *str_local;
  
  scope.field_2._8_8_ = str;
  std::operator+(&local_50,"test error when parse \'",str);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,"\'");
  std::__cxx11::string::~string((string *)&local_50);
  testing::Message::Message(&local_68);
  message = testing::Message::operator<<
                      (&local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30
                      );
  testing::internal::ScopedTrace::ScopedTrace
            (local_5d,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/multiline_literal_string.cpp"
             ,0x1c,message);
  testing::Message::~Message(&local_68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,"key = ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 scope.field_2._8_8_);
  std::__cxx11::istringstream::istringstream
            (local_1e8,
             &handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,8);
  std::__cxx11::string::~string
            ((string *)
             &handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  events_aggregator_t::events_aggregator_t((events_aggregator_t *)&gtest_msg);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffdd8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffdd8);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      loltoml::v_0_1_1::parse<events_aggregator_t>
                ((istream *)local_1e8,(events_aggregator_t *)&gtest_msg);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_001c2a13;
    pcStack_228 = 
    "Expected: loltoml::parse(input, handler) throws an exception of type loltoml::parser_error_t.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_240);
  testing::internal::AssertHelper::AssertHelper
            (&local_248,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/multiline_literal_string.cpp"
             ,0x21,pcStack_228);
  testing::internal::AssertHelper::operator=(&local_248,local_240);
  testing::internal::AssertHelper::~AssertHelper(&local_248);
  testing::Message::~Message(local_240);
LAB_001c2a13:
  events_aggregator_t::~events_aggregator_t((events_aggregator_t *)&gtest_msg);
  std::__cxx11::istringstream::~istringstream(local_1e8);
  testing::internal::ScopedTrace::~ScopedTrace(local_5d);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void test_error(const std::string &str) {
        std::string scope = "test error when parse '" + str + "'";
        SCOPED_TRACE(scope);

        std::istringstream input("key = " + str);
        events_aggregator_t handler;

        EXPECT_THROW(loltoml::parse(input, handler), loltoml::parser_error_t);
    }